

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O0

bool __thiscall
SocketClientTransporter::Connect(SocketClientTransporter *this,string *host,int port,string *err)

{
  char *pcVar1;
  undefined1 local_c8 [8];
  unique_lock<std::mutex> lock;
  int r;
  bool addr_suc;
  sockaddr_storage addr;
  string *err_local;
  int port_local;
  string *host_local;
  SocketClientTransporter *this_local;
  
  (this->uvClient).data = this;
  addr.__ss_align = (unsigned_long)err;
  uv_tcp_init((this->super_Transporter).loop,&this->uvClient);
  lock._15_1_ = Transporter::ParseSocketAddress
                          (host,port,(sockaddr_storage *)&r,(string *)addr.__ss_align);
  if ((bool)lock._15_1_) {
    (this->connect_req).data = this;
    lock._8_4_ = uv_tcp_connect(&this->connect_req,&this->uvClient,(sockaddr *)&r,OnConnectCB);
    if (lock._8_4_ == 0) {
      Transporter::StartEventLoop(&this->super_Transporter);
      std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_c8,&this->mutex);
      std::condition_variable::wait((unique_lock *)&this->cv);
      if (this->connectionStatus < 0) {
        pcVar1 = uv_strerror(this->connectionStatus);
        std::__cxx11::string::operator=((string *)addr.__ss_align,pcVar1);
      }
      this_local._7_1_ = Transporter::IsConnected(&this->super_Transporter);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
    }
    else {
      pcVar1 = uv_strerror(lock._8_4_);
      std::__cxx11::string::operator=((string *)addr.__ss_align,pcVar1);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SocketClientTransporter::Connect(const std::string& host, int port, std::string& err) {
	uvClient.data = this;
	uv_tcp_init(loop, &uvClient);
	struct sockaddr_storage addr;
	bool addr_suc = ParseSocketAddress(host, port, &addr, err);
	if (!addr_suc) {
		return false;
	}

	connect_req.data = this;
	const int r = uv_tcp_connect(&connect_req, &uvClient, reinterpret_cast<const struct sockaddr*>(&addr), OnConnectCB);
	if (r) {
		err = uv_strerror(r);
		return false;
	}
	StartEventLoop();
	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	if (this->connectionStatus < 0) {
		err = uv_strerror(this->connectionStatus);
	}
	return IsConnected();
}